

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O0

void __thiscall
NPC::NPC(NPC *this,Map *map,short id,uchar x,uchar y,uchar spawn_type,short spawn_time,uchar index,
        bool temporary)

{
  uchar local_1d;
  bool temporary_local;
  uchar spawn_type_local;
  uchar y_local;
  uchar x_local;
  short id_local;
  Map *map_local;
  NPC *this_local;
  
  std::__cxx11::
  list<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
  ::list(&this->damagelist);
  this->id = (int)id;
  this->map = map;
  this->temporary = temporary;
  this->index = index;
  this->x = x;
  this->spawn_x = x;
  this->y = y;
  this->spawn_y = y;
  this->alive = false;
  this->attack = false;
  this->totaldamage = 0;
  local_1d = spawn_type;
  if (7 < spawn_type) {
    local_1d = '\a';
  }
  this->spawn_type = local_1d;
  this->spawn_time = spawn_time;
  this->walk_idle_for = 0;
  if (local_1d == '\a') {
    this->direction = (Direction)spawn_time & DIRECTION_RIGHT;
    this->spawn_time = 0;
  }
  else {
    this->direction = DIRECTION_DOWN;
  }
  this->parent = (NPC *)0x0;
  return;
}

Assistant:

NPC::NPC(Map *map, short id, unsigned char x, unsigned char y, unsigned char spawn_type, short spawn_time, unsigned char index, bool temporary)
{
	this->id = id;
	this->map = map;
	this->temporary = temporary;
	this->index = index;
	this->spawn_x = this->x = x;
	this->spawn_y = this->y = y;
	this->alive = false;
	this->attack = false;
	this->totaldamage = 0;

	if (spawn_type > 7)
	{
		spawn_type = 7;
	}

	this->spawn_type = spawn_type;
	this->spawn_time = spawn_time;
	this->walk_idle_for = 0;

	if (spawn_type == 7)
	{
		this->direction = static_cast<Direction>(spawn_time & 0x03);
		this->spawn_time = 0;
	}
	else
	{
		this->direction = DIRECTION_DOWN;
	}

	this->parent = 0;
}